

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
          (SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
           *this)

{
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
  *this_local;
  
  SDLGraphicsSystemWithCreatedWindowTests::SDLGraphicsSystemWithCreatedWindowTests
            (&this->super_SDLGraphicsSystemWithCreatedWindowTests);
  (this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.super_Test.
  _vptr_Test = (_func_int **)
               &
               PTR__SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test_00506208
  ;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath))
        .WillOnce(Return(ByMove(makeSDLSurface(surfacePtr))));
    EXPECT_CALL(*sdlMock, mapRGB(Pointer(surfacePtr), 0, 255, 255))
        .WillOnce(Return(mapRGBResult));
    EXPECT_CALL(*sdlMock, setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult))
        .WillOnce(Return(success));
    EXPECT_CALL(*sdlMock,
        createTextureFromSurface(Pointer(rendererPtr), Pointer(surfacePtr))
    ).WillOnce(ReturnNull());
    EXPECT_CALL(*ptrDeleterMock, surfaceDeleter(surfacePtr));
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}